

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

void validate_tour(Instance *instance,Tour *tour,int32_t min_num_customers_served)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  undefined1 *__ptr;
  void *__ptr_00;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  
  if (tour->num_comps != 1) {
    __assert_fail("tour->num_comps == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x4a,"void validate_tour(const Instance *, Tour *, int32_t)");
  }
  uVar1 = tour->num_customers;
  if (-1 < (int)uVar1) {
    piVar3 = tour->comp;
    if (*piVar3 != 0) {
      __assert_fail("*tcomp(tour, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x51,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
    lVar8 = 0;
    do {
      if (0 < piVar3[lVar8]) {
        __assert_fail("c == 0 || c < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x57,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      lVar8 = lVar8 + 1;
    } while ((ulong)uVar1 + 1 != lVar8);
    uVar9 = 0;
    do {
      if (-1 < piVar3[uVar9]) {
        if (uVar1 < uVar9) goto LAB_00106164;
        if ((tour->succ[uVar9] < 0) || ((int)uVar1 < tour->succ[uVar9])) {
          __assert_fail("*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                        ,0x5f,"void validate_tour(const Instance *, Tour *, int32_t)");
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar1 + 1 != uVar9);
    __ptr = (undefined1 *)calloc((ulong)(uVar1 + 1),1);
    piVar3 = tour->succ;
    if (*piVar3 < 0) {
      __assert_fail("*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x6d,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
    *__ptr = 1;
    uVar9 = 0;
    iVar7 = 1;
    do {
      uVar5 = piVar3[uVar9];
      uVar6 = (ulong)uVar5;
      if (uVar6 == 0) {
        free(__ptr);
        if (iVar7 <= min_num_customers_served) {
          __assert_fail("num_visited - 1 >= (min_num_customers_served)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                        ,0x7f,"void validate_tour(const Instance *, Tour *, int32_t)");
        }
        __ptr_00 = calloc((ulong)(uVar1 + 1),1);
        uVar9 = 0;
        iVar7 = 0;
        do {
          if (*(char *)((long)__ptr_00 + uVar9) == '\0') {
            *(undefined1 *)((long)__ptr_00 + uVar9) = 1;
            uVar6 = uVar9 & 0xffffffff;
            iVar10 = 0;
            do {
              if (uVar1 < (uint)uVar6) goto LAB_00106164;
              uVar5 = tour->succ[uVar6];
              uVar11 = (ulong)(int)uVar5;
              bVar4 = true;
              if (-1 < (long)uVar11) {
                *(undefined1 *)((long)__ptr_00 + uVar11) = 1;
                if (uVar9 == uVar11) {
                  iVar7 = iVar7 + 1;
                }
                else {
                  bVar4 = false;
                  uVar6 = (ulong)uVar5;
                }
              }
            } while ((!bVar4) && (bVar4 = iVar10 < (int)uVar1, iVar10 = iVar10 + 1, bVar4));
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1 + 1);
        if (iVar7 != 1) {
          __assert_fail("num_comps == tour->num_comps",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                        ,0xa3,"void validate_tour(const Instance *, Tour *, int32_t)");
        }
        free(__ptr_00);
        dVar12 = *instance->demands + 0.0;
        uVar5 = 0;
        do {
          uVar2 = tour->succ[uVar5];
          if ((ulong)uVar2 == 0) {
            if ((instance->vehicle_cap <= dVar12) && (1e-05 < ABS(dVar12 - instance->vehicle_cap)))
            {
              __assert_fail("flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                            ,0xaa,"void validate_tour(const Instance *, Tour *, int32_t)");
            }
            return;
          }
          if ((int)uVar2 < 0) {
            __assert_fail("next_vertex >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                          ,0x98,"double tour_demand(const Instance *, Tour *)");
          }
          if (uVar2 == uVar5) {
            __assert_fail("next_vertex != curr_vertex",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                          ,0x99,"double tour_demand(const Instance *, Tour *)");
          }
          dVar12 = dVar12 + instance->demands[uVar2];
          uVar5 = uVar2;
        } while (uVar2 <= uVar1);
        break;
      }
      if (uVar5 == (uint)uVar9) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x75,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      if (((int)uVar5 < 0) || ((int)uVar1 < (int)uVar5)) {
        __assert_fail("next_vertex >= 0 && next_vertex < n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x76,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      if (__ptr[uVar6] != '\0') {
        __assert_fail("visited[next_vertex] == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x77,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      __ptr[uVar6] = 1;
      iVar7 = iVar7 + 1;
      uVar9 = (ulong)uVar5;
    } while (uVar5 <= uVar1);
  }
LAB_00106164:
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

void validate_tour(const Instance *instance, Tour *tour,
                   int32_t min_num_customers_served) {
#ifndef NDEBUG
    int32_t n = tour->num_customers + 1;

    //
    // There should be only one subtour
    //
    assert(tour->num_comps == 1);

    //
    // The same subtour should share the same component idx
    //
    {
        // Depot is always part of the tour
        assert(*tcomp(tour, 0) == 0);

        // Check that each vertex is either part of the first and only tour
        // or otherwise it is not visited
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            assert(c == 0 || c < 0);
        }

        // Check that each vertex if is part of a component index it has its
        // succ populated
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            if (c >= 0) {
                assert(*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n);
            }
        }
    }

    //
    // Validate succ array consistency:
    //       - Assert succ is within range
    //       - Vertices cannot be visited twice
    //
    {
        int32_t num_visited = 0;
        bool *visited = calloc(n, sizeof(*visited));
        if (*tcomp(tour, 0) >= 0) {
            assert(*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0);
            visited[0] = true;
            ++num_visited;

            int32_t curr_vertex = 0;
            int32_t next_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
                assert(next_vertex != curr_vertex);
                assert(next_vertex >= 0 && next_vertex < n);
                assert(visited[next_vertex] == false);
                visited[next_vertex] = true;
                ++num_visited;
                curr_vertex = next_vertex;
            }
        }
        free(visited);

        assert(num_visited - 1 >= (min_num_customers_served));
    }

    //
    // Verify that the number of components that the tour reports
    // is actually consistent with what is encoded in the succ array
    //
    {

        bool *visited = calloc(n, sizeof(*visited));
        int32_t num_comps = 0;
        for (int32_t i = 0; i < n; i++) {
            if (visited[i] == false) {
                int32_t first_vertex = i;
                int32_t curr_vertex = first_vertex;

                visited[first_vertex] = true;

                for (int32_t retries = 0; retries < n; retries++) {
                    int32_t next_vertex = *tsucc(tour, curr_vertex);
                    if (next_vertex < 0) {
                        break;
                    }

                    visited[next_vertex] = true;

                    if (next_vertex == first_vertex) {
                        num_comps++;
                        break;
                    }

                    curr_vertex = next_vertex;
                }
            }
        }

        assert(num_comps == tour->num_comps);
        free(visited);
    }

    //
    // Validate capacity is not exceeded
    //
    assert(flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(tour);
#endif
}